

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O3

SIMDType simd::actualSimdType(void)

{
  SIMDType SVar1;
  
  if (((!isAvxAvailable) || (SVar1 = avx_function, isAvxEnabled == '\0')) &&
     ((!isSseAvailable || (SVar1 = sse_function, isSseEnabled == '\0')))) {
    SVar1 = cpu_function;
  }
  return SVar1;
}

Assistant:

SIMDType actualSimdType()
    {
        #ifdef PENGUINV_AVX_SET
        if ( isAvxAvailable && isAvxEnabled )
            return avx_function;
        #endif

        #ifdef PENGUINV_SSE_SET
        if ( isSseAvailable && isSseEnabled )
            return sse_function;
        #endif

        #ifdef PENGUINV_NEON_SET
        if ( isNeonAvailable && isNeonEnabled )
            return neon_function;
        #endif

        return cpu_function;
    }